

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * cfd::core::Pubkey::CombinePubkey
                   (Pubkey *__return_storage_ptr__,
                   vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys)

{
  pointer this;
  bool bVar1;
  ByteData local_90;
  ByteData local_68;
  reference local_50;
  Pubkey *pubkey;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> data_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys_local;
  
  data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pubkeys;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&__range2);
  this = data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                     ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                      data_list.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pubkey = (Pubkey *)
           ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                     ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                                *)&pubkey);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
               ::operator*(&__end2);
    GetData(&local_68,local_50);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&__range2,
               &local_68);
    ByteData::~ByteData(&local_68);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
    ::operator++(&__end2);
  }
  WallyUtil::CombinePubkeySecp256k1Ec
            (&local_90,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&__range2);
  Pubkey(__return_storage_ptr__,&local_90);
  ByteData::~ByteData(&local_90);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CombinePubkey(const std::vector<Pubkey> &pubkeys) {
  std::vector<ByteData> data_list;
  for (const auto &pubkey : pubkeys) {
    data_list.push_back(pubkey.GetData());
  }
  return Pubkey(WallyUtil::CombinePubkeySecp256k1Ec(data_list));
}